

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall
spirv_cross::ParsedIR::set_decoration_string
          (ParsedIR *this,ID id,Decoration decoration,string *argument)

{
  mapped_type *pmVar1;
  Decoration *dec;
  string *argument_local;
  Decoration decoration_local;
  ParsedIR *this_local;
  ID id_local;
  
  this_local._4_4_ = id.id;
  pmVar1 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&this->meta,(key_type *)((long)&this_local + 4));
  Bitset::set(&(pmVar1->decoration).decoration_flags,decoration);
  if (decoration == DecorationHlslSemanticGOOGLE) {
    ::std::__cxx11::string::operator=
              ((string *)&(pmVar1->decoration).hlsl_semantic,(string *)argument);
  }
  return;
}

Assistant:

void ParsedIR::set_decoration_string(ID id, Decoration decoration, const string &argument)
{
	auto &dec = meta[id].decoration;
	dec.decoration_flags.set(decoration);

	switch (decoration)
	{
	case DecorationHlslSemanticGOOGLE:
		dec.hlsl_semantic = argument;
		break;

	default:
		break;
	}
}